

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::priceByRowDenseResult
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,HVector *column,
          HighsInt from_index,HighsInt debug_report)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  reference pvVar4;
  int in_ECX;
  long in_RDX;
  HighsSparseMatrix *in_RSI;
  int *in_RDI;
  int in_R8D;
  double value1;
  double value0;
  HighsInt iCol;
  HighsInt iEl;
  HighsInt to_iEl;
  double multiplier;
  HighsInt iRow;
  HighsInt ix;
  double local_70;
  int local_38;
  int local_34;
  vector<double,_std::allocator<double>_> *result_00;
  vector<double,_std::allocator<double>_> *pvVar5;
  int iVar6;
  
  iVar6 = in_ECX;
  for (; in_ECX < *(int *)(in_RDX + 4); in_ECX = in_ECX + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDX + 8),(long)in_ECX);
    iVar1 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)iVar1);
    result_00 = (vector<double,_std::allocator<double>_> *)*pvVar3;
    if (*in_RDI == 3) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 10),(long)iVar1);
      local_34 = *pvVar2;
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)(iVar1 + 1));
      local_34 = *pvVar2;
    }
    if ((in_R8D == -1) || (in_R8D == iVar1)) {
      debugReportRowPrice(in_RSI,(HighsInt)((ulong)in_RDX >> 0x20),(double)CONCAT44(iVar6,in_R8D),
                          in_ECX,result_00);
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)iVar1);
    for (local_38 = *pvVar2; local_38 < local_34; local_38 = local_38 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_38);
      iVar1 = *pvVar2;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_RSI,(long)iVar1);
      local_70 = *pvVar4;
      pvVar5 = result_00;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x16),(long)local_38)
      ;
      local_70 = (double)result_00 * *pvVar3 + local_70;
      if (ABS(local_70) < 1e-14) {
        local_70 = 1e-50;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_RSI,(long)iVar1);
      *pvVar4 = local_70;
      result_00 = pvVar5;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::priceByRowDenseResult(
    std::vector<double>& result, const HVector& column,
    const HighsInt from_index, const HighsInt debug_report) const {
  // Assumes that result is zeroed beforehand - in case continuing
  // priceByRow after switch from sparse
  assert(this->isRowwise());
  for (HighsInt ix = from_index; ix < column.count; ix++) {
    HighsInt iRow = column.index[ix];
    double multiplier = column.array[iRow];
    // Determine whether p_end_ or the next start_ should be used to end the
    // loop
    HighsInt to_iEl;
    if (this->format_ == MatrixFormat::kRowwisePartitioned) {
      to_iEl = this->p_end_[iRow];
    } else {
      to_iEl = this->start_[iRow + 1];
    }
    if (debug_report == kDebugReportAll || debug_report == iRow)
      debugReportRowPrice(iRow, multiplier, to_iEl, result);
    for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
      HighsInt iCol = this->index_[iEl];
      double value0 = result[iCol];
      double value1 = value0 + multiplier * this->value_[iEl];
      result[iCol] = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    }
  }
}